

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O2

int __thiscall cmCPackSTGZGenerator::GenerateHeader(cmCPackSTGZGenerator *this,ostream *os)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  string res;
  string packageHeaderText;
  string licenseText;
  string line;
  char *local_a38 [4];
  string inFile;
  string inLicFile;
  char headerLengthTag [26];
  char buffer [1024];
  ifstream ilfs;
  ifstream ifs;
  ostringstream str;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)buffer);
  poVar4 = std::operator<<((ostream *)buffer,"Writing header");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = (this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator.
           Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                  ,0x44,_ilfs);
  std::__cxx11::string::~string((string *)&ilfs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)buffer);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  std::__cxx11::string::string((string *)buffer,"CPACK_RESOURCE_FILE_LICENSE",(allocator *)&ilfs);
  pcVar5 = cmCPackGenerator::GetOption((cmCPackGenerator *)this,(string *)buffer);
  std::__cxx11::string::string((string *)&inLicFile,pcVar5,(allocator *)&ifs);
  std::__cxx11::string::~string((string *)buffer);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&ilfs,inLicFile._M_dataplus._M_p,_S_in);
  licenseText._M_dataplus._M_p = (pointer)&licenseText.field_2;
  licenseText._M_string_length = 0;
  licenseText.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar2 = cmsys::SystemTools::GetLineFromStream((istream *)&ilfs,&line,(bool *)0x0,-1);
    if (!bVar2) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,&line
                   ,"\n");
    std::__cxx11::string::append((string *)&licenseText);
    std::__cxx11::string::~string((string *)buffer);
  }
  std::__cxx11::string::string
            ((string *)buffer,"CPACK_RESOURCE_FILE_LICENSE_CONTENT",(allocator *)&ifs);
  cmCPackGenerator::SetOptionIfNotSet
            ((cmCPackGenerator *)this,(string *)buffer,licenseText._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)buffer);
  builtin_strncpy(headerLengthTag + 0x10,"LENGTH###",10);
  builtin_strncpy(headerLengthTag,"###CPACK_HEADER_",0x10);
  std::__cxx11::string::string((string *)buffer,"CPACK_STGZ_HEADER_FILE",(allocator *)&ifs);
  pcVar5 = cmCPackGenerator::GetOption((cmCPackGenerator *)this,(string *)buffer);
  std::__cxx11::string::string((string *)&inFile,pcVar5,(allocator *)&packageHeaderText);
  std::__cxx11::string::~string((string *)buffer);
  std::ifstream::ifstream(&ifs,inFile._M_dataplus._M_p,_S_in);
  packageHeaderText._M_dataplus._M_p = (pointer)&packageHeaderText.field_2;
  packageHeaderText._M_string_length = 0;
  packageHeaderText.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar2 = cmsys::SystemTools::GetLineFromStream((istream *)&ifs,&line,(bool *)0x0,-1);
    if (!bVar2) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,&line
                   ,"\n");
    std::__cxx11::string::append((string *)&packageHeaderText);
    std::__cxx11::string::~string((string *)buffer);
  }
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  (*(this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator.
    _vptr_cmCPackGenerator[0xe])(this,&packageHeaderText,&res);
  iVar3 = 0;
  _Var6._M_p = res._M_dataplus._M_p;
  do {
    if (*_Var6._M_p == '\n') {
      iVar3 = iVar3 + 1;
    }
    else if (*_Var6._M_p == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buffer);
      poVar4 = std::operator<<((ostream *)buffer,"Number of lines: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3 + 1U);
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = (this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.
               super_cmCPackGenerator.Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                      ,0x6a,local_a38[0]);
      std::__cxx11::string::~string((string *)local_a38);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buffer);
      sprintf(buffer,"%d",(ulong)(iVar3 + 1U));
      cmsys::SystemTools::ReplaceString(&res,headerLengthTag,buffer);
      std::operator<<(os,(string *)&res);
      iVar3 = cmCPackArchiveGenerator::GenerateHeader((cmCPackArchiveGenerator *)this,os);
      std::__cxx11::string::~string((string *)&res);
      std::__cxx11::string::~string((string *)&packageHeaderText);
      std::ifstream::~ifstream(&ifs);
      std::__cxx11::string::~string((string *)&inFile);
      std::__cxx11::string::~string((string *)&licenseText);
      std::ifstream::~ifstream(&ilfs);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&inLicFile);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
      return iVar3;
    }
    _Var6._M_p = _Var6._M_p + 1;
  } while( true );
}

Assistant:

int cmCPackSTGZGenerator::GenerateHeader(std::ostream* os)
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Writing header" << std::endl);
  std::ostringstream str;
  int counter = 0;

  std::string inLicFile = this->GetOption("CPACK_RESOURCE_FILE_LICENSE");
  std::string line;
  cmsys::ifstream ilfs(inLicFile.c_str());
  std::string licenseText;
  while (cmSystemTools::GetLineFromStream(ilfs, line)) {
    licenseText += line + "\n";
  }
  this->SetOptionIfNotSet("CPACK_RESOURCE_FILE_LICENSE_CONTENT",
                          licenseText.c_str());

  const char headerLengthTag[] = "###CPACK_HEADER_LENGTH###";

  // Create the header
  std::string inFile = this->GetOption("CPACK_STGZ_HEADER_FILE");
  cmsys::ifstream ifs(inFile.c_str());
  std::string packageHeaderText;
  while (cmSystemTools::GetLineFromStream(ifs, line)) {
    packageHeaderText += line + "\n";
  }

  // Configure in the values
  std::string res;
  this->ConfigureString(packageHeaderText, res);

  // Count the lines
  const char* ptr = res.c_str();
  while (*ptr) {
    if (*ptr == '\n') {
      counter++;
    }
    ++ptr;
  }
  counter++;
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Number of lines: " << counter
                                                           << std::endl);
  char buffer[1024];
  sprintf(buffer, "%d", counter);
  cmSystemTools::ReplaceString(res, headerLengthTag, buffer);

  // Write in file
  *os << res;
  return this->Superclass::GenerateHeader(os);
}